

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev.c
# Opt level: O0

void * array_realloc(int elem,void *base,int *cur,int cnt)

{
  int iVar1;
  void *pvVar2;
  int cnt_local;
  int *cur_local;
  void *base_local;
  int elem_local;
  
  iVar1 = array_nextsize(elem,*cur,cnt);
  *cur = iVar1;
  pvVar2 = ev_realloc(base,(long)(elem * *cur));
  return pvVar2;
}

Assistant:

ecb_cold
array_realloc (int elem, void *base, int *cur, int cnt)
{
  *cur = array_nextsize (elem, *cur, cnt);
  return ev_realloc (base, elem * *cur);
}